

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCut.c
# Opt level: O2

uint * Lpk_CutTruth_rec(Hop_Man_t *pMan,Hop_Obj_t *pObj,int nVars,Vec_Ptr_t *vTtNodes,int *piCount)

{
  Hop_Obj_t *pHVar1;
  char cVar2;
  Hop_Obj_t *pHVar3;
  int iVar4;
  uint *puVar5;
  ulong uVar6;
  uint *puVar7;
  uint *puVar8;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkCut.c"
                  ,0x8d,
                  "unsigned int *Lpk_CutTruth_rec(Hop_Man_t *, Hop_Obj_t *, int, Vec_Ptr_t *, int *)"
                 );
  }
  puVar5 = (uint *)(pObj->field_0).pData;
  if (puVar5 == (uint *)0x0) {
    iVar4 = *piCount;
    *piCount = iVar4 + 1;
    puVar5 = (uint *)Vec_PtrEntry(vTtNodes,iVar4);
    iVar4 = Hop_ObjIsConst1(pObj);
    cVar2 = (char)nVars;
    if (iVar4 == 0) {
      if ((*(uint *)&pObj->field_0x20 & 7) != 4) {
        __assert_fail("Hop_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkCut.c"
                      ,0x99,
                      "unsigned int *Lpk_CutTruth_rec(Hop_Man_t *, Hop_Obj_t *, int, Vec_Ptr_t *, int *)"
                     );
      }
      puVar7 = Lpk_CutTruth_rec(pMan,(Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),nVars,
                                vTtNodes,piCount);
      puVar8 = Lpk_CutTruth_rec(pMan,(Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),nVars,
                                vTtNodes,piCount);
      pHVar3 = pObj->pFanin0;
      pHVar1 = pObj->pFanin1;
      if (((ulong)pHVar1 & 1) == 0 || ((ulong)pHVar3 & 1) == 0) {
        if (((ulong)pHVar3 & 1) == 0 || ((ulong)pHVar1 & 1) != 0) {
          uVar6 = (ulong)(uint)(1 << (cVar2 - 5U & 0x1f));
          if (nVars < 6) {
            uVar6 = 1;
          }
          if ((((ulong)pHVar3 & 1) == 0 & (byte)pHVar1) == 0) {
            for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
              puVar5[uVar6 - 1] = puVar8[uVar6 - 1] & puVar7[uVar6 - 1];
            }
          }
          else {
            for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
              puVar5[uVar6 - 1] = ~puVar8[uVar6 - 1] & puVar7[uVar6 - 1];
            }
          }
        }
        else {
          uVar6 = (ulong)(uint)(1 << (cVar2 - 5U & 0x1f));
          if (nVars < 6) {
            uVar6 = 1;
          }
          for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
            puVar5[uVar6 - 1] = ~puVar7[uVar6 - 1] & puVar8[uVar6 - 1];
          }
        }
      }
      else {
        uVar6 = (ulong)(uint)(1 << (cVar2 - 5U & 0x1f));
        if (nVars < 6) {
          uVar6 = 1;
        }
        for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
          puVar5[uVar6 - 1] = ~(puVar8[uVar6 - 1] | puVar7[uVar6 - 1]);
        }
      }
    }
    else {
      uVar6 = (ulong)(uint)(1 << (cVar2 - 5U & 0x1f));
      if (nVars < 6) {
        uVar6 = 1;
      }
      for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
        puVar5[uVar6 - 1] = 0xffffffff;
      }
    }
    (pObj->field_0).pData = puVar5;
  }
  else if ((short)((ulong)puVar5 >> 0x10) == 0) {
    __assert_fail("((unsigned)(ABC_PTRUINT_T)pObj->pData) & 0xffff0000",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/lpk/lpkCut.c"
                  ,0x90,
                  "unsigned int *Lpk_CutTruth_rec(Hop_Man_t *, Hop_Obj_t *, int, Vec_Ptr_t *, int *)"
                 );
  }
  return puVar5;
}

Assistant:

unsigned * Lpk_CutTruth_rec( Hop_Man_t * pMan, Hop_Obj_t * pObj, int nVars, Vec_Ptr_t * vTtNodes, int * piCount )
{
    unsigned * pTruth, * pTruth0, * pTruth1;
    assert( !Hop_IsComplement(pObj) );
    if ( pObj->pData )
    {
        assert( ((unsigned)(ABC_PTRUINT_T)pObj->pData) & 0xffff0000 );
        return (unsigned *)pObj->pData;
    }
    // get the plan for a new truth table
    pTruth = (unsigned *)Vec_PtrEntry( vTtNodes, (*piCount)++ );
    if ( Hop_ObjIsConst1(pObj) )
        Kit_TruthFill( pTruth, nVars );
    else
    {
        assert( Hop_ObjIsAnd(pObj) );
        // compute the truth tables of the fanins
        pTruth0 = Lpk_CutTruth_rec( pMan, Hop_ObjFanin0(pObj), nVars, vTtNodes, piCount );
        pTruth1 = Lpk_CutTruth_rec( pMan, Hop_ObjFanin1(pObj), nVars, vTtNodes, piCount );
        // creat the truth table of the node
        Kit_TruthAndPhase( pTruth, pTruth0, pTruth1, nVars, Hop_ObjFaninC0(pObj), Hop_ObjFaninC1(pObj) );
    }
    pObj->pData = pTruth;
    return pTruth;
}